

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O0

void __thiscall soul::AST::ImportsList::addIfNotAlreadyThere(ImportsList *this,string *newImport)

{
  bool bVar1;
  string local_58;
  string local_38;
  string *local_18;
  string *newImport_local;
  ImportsList *this_local;
  
  local_18 = newImport;
  newImport_local = (string *)this;
  std::__cxx11::string::string((string *)&local_58,(string *)newImport);
  choc::text::trim(&local_38,&local_58);
  std::__cxx11::string::operator=((string *)newImport,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  bVar1 = contains<soul::ArrayWithPreallocation<std::__cxx11::string,4ul>,std::__cxx11::string&>
                    (&this->imports,newImport);
  if (!bVar1) {
    ArrayWithPreallocation<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
    ::push_back(&this->imports,newImport);
  }
  return;
}

Assistant:

void addIfNotAlreadyThere (std::string newImport)
        {
            newImport = choc::text::trim (newImport);

            if (! contains (imports, newImport))
                imports.push_back (newImport);
        }